

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

float __thiscall SVGChart::LogTrafo::Transform(LogTrafo *this,float inValue)

{
  float fVar1;
  
  fVar1 = 1e-10;
  if (1e-10 <= inValue) {
    fVar1 = inValue;
  }
  fVar1 = SafeLog(fVar1,this->mBase,this->mFactor);
  return fVar1 * this->mSlope + this->mOffset;
}

Assistant:

float LogTrafo::Transform (float inValue) const{
      if (inValue<kLogMinClipValue) {
        inValue = kLogMinClipValue;
      }
      return SafeLog (inValue, mBase, mFactor)*mSlope+mOffset;
    }